

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.h
# Opt level: O2

CFL_ALLOWED_TYPE store_cfl_required(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  MB_MODE_INFO *pMVar1;
  
  if (cm->seq_params->monochrome == '\0') {
    if (xd->is_chroma_ref != true) {
      return '\x01';
    }
    pMVar1 = *xd->mi;
    if (((pMVar1->field_0xa7 & 0x80) == 0) && (pMVar1->ref_frame[0] < '\x01')) {
      return pMVar1->uv_mode == '\r';
    }
  }
  return '\0';
}

Assistant:

static inline CFL_ALLOWED_TYPE store_cfl_required(const AV1_COMMON *cm,
                                                  const MACROBLOCKD *xd) {
  const MB_MODE_INFO *mbmi = xd->mi[0];

  if (cm->seq_params->monochrome) return CFL_DISALLOWED;

  if (!xd->is_chroma_ref) {
    // For non-chroma-reference blocks, we should always store the luma pixels,
    // in case the corresponding chroma-reference block uses CfL.
    // Note that this can only happen for block sizes which are <8 on
    // their shortest side, as otherwise they would be chroma reference
    // blocks.
    return CFL_ALLOWED;
  }

  // If this block has chroma information, we know whether we're
  // actually going to perform a CfL prediction
  return (CFL_ALLOWED_TYPE)(!is_inter_block(mbmi) &&
                            mbmi->uv_mode == UV_CFL_PRED);
}